

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::FormatString<char[47],char_const*,char[15],char[16],unsigned_int,char[48]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [47],char **Args_1,
          char (*Args_2) [15],char (*Args_3) [16],uint *Args_4,char (*Args_5) [48])

{
  stringstream local_1c0 [8];
  stringstream ss;
  uint *Args_local_4;
  char (*Args_local_3) [16];
  char (*Args_local_2) [15];
  char **Args_local_1;
  char (*Args_local) [47];
  
  std::__cxx11::stringstream::stringstream(local_1c0);
  FormatStrSS<std::__cxx11::stringstream,char[47],char_const*,char[15],char[16],unsigned_int,char[48]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
             (char (*) [47])this,(char **)Args,(char (*) [15])Args_1,(char (*) [16])Args_2,
             (uint *)Args_3,(char (*) [48])Args_4);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}